

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O1

int ps_config_validate(ps_config_t *config)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  lVar7 = 0;
  uVar6 = 0;
  while ((pcVar2 = ps_config_str(config,*(char **)((long)searches + lVar7)), pcVar2 == (char *)0x0
         || (bVar1 = uVar6 == 0, uVar6 = 1, bVar1))) {
    lVar7 = lVar7 + 8;
    if (lVar7 == 0x38) {
LAB_00109faf:
      iVar5 = 0;
      if (1 < uVar6) {
        iVar5 = 0xc;
        lVar7 = 0;
        do {
          sVar3 = strlen(*(char **)((long)searches + lVar7));
          iVar4 = iVar5 + (int)sVar3;
          iVar5 = iVar4 + 2;
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0x38);
        pcVar2 = (char *)__ckd_malloc__((long)(iVar4 + 0x26),
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                                        ,0x97);
        builtin_strncpy(pcVar2,"Only one of ",0xd);
        lVar7 = 0;
        do {
          strcat(pcVar2,*(char **)((long)searches + lVar7));
          sVar3 = strlen(pcVar2);
          (pcVar2 + sVar3)[0] = ',';
          (pcVar2 + sVar3)[1] = ' ';
          pcVar2[sVar3 + 2] = '\0';
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0x38);
        sVar3 = strlen(pcVar2);
        builtin_strncpy(pcVar2 + sVar3,"can be enabled at a time in config\n",0x24);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                ,0x9e,pcVar2);
        ckd_free(pcVar2);
        iVar5 = -1;
      }
      return iVar5;
    }
  }
  uVar6 = 2;
  goto LAB_00109faf;
}

Assistant:

int
ps_config_validate(ps_config_t *config)
{
    int i, found = 0;
    for (i = 0; i < nsearches; ++i) {
        if (ps_config_str(config, searches[i]) != NULL)
            if (++found > 1)
                break;
    }
    if (found > 1) {
        int len = strlen("Only one of ");
        char *msg;
        for (i = 0; i < nsearches; ++i)
            len += strlen(searches[i]) + 2;
        len += strlen("can be enabled at a time in config\n");
        msg = ckd_malloc(len + 1);
        strcpy(msg, "Only one of ");
        for (i = 0; i < nsearches; ++i) {
            strcat(msg, searches[i]);
            strcat(msg, ", ");
        }
        strcat(msg, "can be enabled at a time in config\n");
        E_ERROR(msg);
        ckd_free(msg);
        return -1;
    }
    return 0;
}